

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

void __thiscall rpc_tests::help_example::test_method(help_example *this)

{
  size_type *psVar1;
  long *plVar2;
  string key;
  string key_00;
  string key_01;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  int iVar3;
  long *plVar4;
  long lVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  bool bVar8;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_00;
  const_string file_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_01;
  const_string file_03;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_02;
  const_string file_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_03;
  const_string file_05;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_04;
  const_string file_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_05;
  const_string file_07;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_06;
  const_string file_08;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_07;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_08;
  const_string file_09;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_09;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  undefined8 in_stack_fffffffffffff7a8;
  undefined8 in_stack_fffffffffffff7b0;
  undefined8 in_stack_fffffffffffff7b8;
  undefined8 in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7c8;
  undefined1 in_stack_fffffffffffff7d0 [39];
  allocator_type in_stack_fffffffffffff7f7;
  pointer in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff800 [16];
  undefined8 in_stack_fffffffffffff810;
  pointer in_stack_fffffffffffff818;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  local_6b0;
  string *local_698;
  string *local_690;
  char *local_688;
  char *local_680;
  assertion_result local_678;
  ne_impl local_659;
  undefined1 local_658 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  _Alloc_hider local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610;
  vector<UniValue,_std::allocator<UniValue>_> local_5f8;
  string local_5e0;
  undefined1 local_5c0 [32];
  string local_5a0;
  string local_580;
  UniValue local_560;
  UniValue local_508;
  UniValue local_4b0;
  undefined1 *local_458;
  undefined8 local_450;
  undefined1 local_448 [9];
  undefined4 local_43f;
  undefined2 local_43b;
  char local_439;
  UniValue arr_value;
  undefined1 local_3e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3d0;
  UniValue local_3c0;
  long *local_368 [2];
  long local_358 [2];
  UniValue local_348;
  long *local_2f0 [2];
  long local_2e0 [2];
  UniValue local_2d0;
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248;
  undefined4 local_23f;
  undefined2 local_23b;
  char local_239;
  UniValue obj_value;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<UniValue,_std::allocator<UniValue>_> local_180;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_f0;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[4],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [4])0xf9edff,(char (*) [4])0xf98a78);
  obj_value.typ._0_1_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[2],_bool,_true>(&local_168,(char (*) [2])0xe81e5f,(bool *)&obj_value);
  local_658._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[2],_int,_true>(&local_f0,(char (*) [2])0xfc5654,(int *)local_658);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector(&local_6b0,__l,(allocator_type *)&arr_value);
  lVar5 = 0x168;
  do {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)
               ((long)&obj_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&obj_value.keys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar5));
    plVar2 = *(long **)((long)&obj_value.val._M_dataplus._M_p + lVar5);
    plVar4 = (long *)(obj_value.val.field_2._M_local_buf + lVar5);
    if (plVar4 != plVar2) {
      operator_delete(plVar2,*plVar4 + 1);
    }
    if ((long *)((long)&local_248 + lVar5) != *(long **)((long)local_258 + lVar5)) {
      operator_delete(*(long **)((long)local_258 + lVar5),*(long *)((long)&local_248 + lVar5) + 1);
    }
    lVar5 = lVar5 + -0x78;
  } while (lVar5 != 0);
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x22c;
  file.m_begin = (iterator)&local_6c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_6d0,msg);
  obj_value.val._M_dataplus._M_p = obj_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  obj_value._0_8_ = &PTR__lazy_ostream_013d3cb0;
  obj_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  obj_value.val.field_2._M_local_buf[0] = 'L';
  obj_value.val.field_2._M_allocated_capacity._1_7_ = 0xf98c;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"test","");
  HelpExampleCliNamed((string *)&arr_value,(string *)local_58,&local_6b0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arr_value
                     ,"> bitcoin-cli -named test foo=bar b=true n=1\n");
  local_78[0] = iVar3 == 0;
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_3e0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3e0._8_8_ = "";
  local_1e0[8] = 0;
  local_1e0._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_1d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5a0._M_dataplus._M_p = "> bitcoin-cli -named test foo=bar b=true n=1\n";
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d78d0;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_648._8_8_ = &local_5a0;
  local_580._M_dataplus._M_p = (pointer)&arr_value;
  local_1d0._8_8_ = &local_580;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)&obj_value,1,2,REQUIRE,0xeee98e,
             (size_t)local_3e0,0x22c,(iterator)local_1e0,
             "\"> bitcoin-cli -named test foo=bar b=true n=1\\n\"",local_658);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  psVar1 = &arr_value.val._M_string_length;
  if ((size_type *)arr_value._0_8_ != psVar1) {
    operator_delete((void *)arr_value._0_8_,arr_value.val._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x22d;
  file_00.m_begin = (iterator)&local_6e0;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_6f0,
             msg_00);
  obj_value.val._M_dataplus._M_p = obj_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  obj_value._0_8_ = &PTR__lazy_ostream_013d3cb0;
  obj_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  obj_value.val.field_2._M_local_buf[0] = 'L';
  obj_value.val.field_2._M_allocated_capacity._1_7_ = 0xf98c;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"test","");
  HelpExampleRpcNamed((string *)&arr_value,(string *)local_58,&local_6b0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arr_value
                     ,
                     "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"foo\":\"bar\",\"b\":true,\"n\":1}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
                    );
  local_78[0] = iVar3 == 0;
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_3e0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3e0._8_8_ = "";
  local_1e0[8] = 0;
  local_1e0._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_1d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5a0._M_dataplus._M_p =
       "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"foo\":\"bar\",\"b\":true,\"n\":1}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
  ;
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d7910;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_648._8_8_ = &local_5a0;
  local_580._M_dataplus._M_p = (pointer)&arr_value;
  local_1d0._8_8_ = &local_580;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)&obj_value,1,2,REQUIRE,0xeeea0f,
             (size_t)local_3e0,0x22d,(iterator)local_1e0,
             "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"foo\\\":\\\"bar\\\",\\\"b\\\":true,\\\"n\\\":1}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
             ,local_658);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  if ((size_type *)arr_value._0_8_ != psVar1) {
    operator_delete((void *)arr_value._0_8_,arr_value.val._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x230;
  file_01.m_begin = (iterator)&local_700;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_710,
             msg_01);
  arr_value.val._M_dataplus._M_p = arr_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  arr_value._0_8_ = &PTR__lazy_ostream_013d3cb0;
  arr_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  arr_value.val.field_2._M_local_buf[0] = 'L';
  arr_value.val.field_2._M_allocated_capacity._1_7_ = 0xf98c;
  local_78._0_8_ = &aStack_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"test","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [4])0xf9edff,(char (*) [5])"b\'ar");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_580,__l_00,(allocator_type *)&local_678);
  HelpExampleCliNamed((string *)local_58,(string *)local_78,(RPCArgList *)&local_580);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "> bitcoin-cli -named test foo=\'b\'\'\'ar\'\n");
  local_3e0[0] = iVar3 == 0;
  local_3e0._8_8_ = (element_type *)0x0;
  aStack_3d0._M_allocated_capacity = 0;
  local_5a0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5a0._M_string_length = 0xeeaba1;
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5e0._M_dataplus._M_p = "> bitcoin-cli -named test foo=\'b\'\'\'ar\'\n";
  obj_value.val._M_dataplus._M_p = obj_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  obj_value._0_8_ = &PTR__lazy_ostream_013d6738;
  obj_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  obj_value.val.field_2._M_local_buf[0] = (char)&local_5e0;
  obj_value.val.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)&local_5e0 >> 8);
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_648._8_8_ = local_5c0;
  local_5c0._0_8_ = (pointer)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3e0,(lazy_ostream *)&arr_value,1,2,REQUIRE,0xeeebd7,
             (size_t)&local_5a0,0x230,local_658,"\"> bitcoin-cli -named test foo=\'b\'\'\'ar\'\\n\""
             ,&obj_value);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3d0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_580);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
  }
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x231;
  file_02.m_begin = (iterator)&local_720;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_730,
             msg_02);
  arr_value.val._M_dataplus._M_p = arr_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  arr_value._0_8_ = &PTR__lazy_ostream_013d3cb0;
  arr_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  arr_value.val.field_2._M_local_buf[0] = 'L';
  arr_value.val.field_2._M_allocated_capacity._1_7_ = 0xf98c;
  local_78._0_8_ = &aStack_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"test","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [4])0xf9edff,(char (*) [5])"b\"ar");
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_580,__l_01,(allocator_type *)&local_678);
  HelpExampleCliNamed((string *)local_58,(string *)local_78,(RPCArgList *)&local_580);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "> bitcoin-cli -named test foo=\'b\"ar\'\n");
  local_3e0[0] = iVar3 == 0;
  local_3e0._8_8_ = (element_type *)0x0;
  aStack_3d0._M_allocated_capacity = 0;
  local_5a0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5a0._M_string_length = 0xeeaba1;
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5e0._M_dataplus._M_p = "> bitcoin-cli -named test foo=\'b\"ar\'\n";
  obj_value.val._M_dataplus._M_p = obj_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  obj_value._0_8_ = &PTR__lazy_ostream_013d7950;
  obj_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  obj_value.val.field_2._M_local_buf[0] = (char)&local_5e0;
  obj_value.val.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)&local_5e0 >> 8);
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_648._8_8_ = local_5c0;
  local_5c0._0_8_ = (pointer)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3e0,(lazy_ostream *)&arr_value,1,2,REQUIRE,0xeeec5e,
             (size_t)&local_5a0,0x231,local_658,"\"> bitcoin-cli -named test foo=\'b\\\"ar\'\\n\"",
             &obj_value);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3d0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_580);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
  }
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x232;
  file_03.m_begin = (iterator)&local_740;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_750,
             msg_03);
  arr_value.val._M_dataplus._M_p = arr_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  arr_value._0_8_ = &PTR__lazy_ostream_013d3cb0;
  arr_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  arr_value.val.field_2._M_local_buf[0] = 'L';
  arr_value.val.field_2._M_allocated_capacity._1_7_ = 0xf98c;
  local_78._0_8_ = &aStack_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"test","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [4])0xf9edff,(char (*) [5])"b ar");
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_580,__l_02,(allocator_type *)&local_678);
  HelpExampleCliNamed((string *)local_58,(string *)local_78,(RPCArgList *)&local_580);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "> bitcoin-cli -named test foo=\'b ar\'\n");
  local_3e0[0] = iVar3 == 0;
  local_3e0._8_8_ = (element_type *)0x0;
  aStack_3d0._M_allocated_capacity = 0;
  local_5a0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5a0._M_string_length = 0xeeaba1;
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5e0._M_dataplus._M_p = "> bitcoin-cli -named test foo=\'b ar\'\n";
  obj_value.val._M_dataplus._M_p = obj_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  obj_value._0_8_ = &PTR__lazy_ostream_013d7950;
  obj_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  obj_value.val.field_2._M_local_buf[0] = (char)&local_5e0;
  obj_value.val.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)&local_5e0 >> 8);
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_648._8_8_ = local_5c0;
  local_5c0._0_8_ = (pointer)local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3e0,(lazy_ostream *)&arr_value,1,2,REQUIRE,0xeeece3,
             (size_t)&local_5a0,0x232,local_658,"\"> bitcoin-cli -named test foo=\'b ar\'\\n\"",
             &obj_value);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_3d0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_580);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
  }
  local_258[0] = &local_248;
  local_258[1] = (long *)0x0;
  obj_value.val._M_dataplus._M_p = (pointer)&obj_value.val.field_2;
  obj_value.typ = VOBJ;
  obj_value.val.field_2._M_local_buf[0] = '\0';
  obj_value.val.field_2._M_allocated_capacity._1_7_ = (undefined7)stack0xfffffffffffffdb9;
  obj_value.val.field_2._M_local_buf[8] = (char)((ulong)stack0xfffffffffffffdb9 >> 0x38);
  obj_value.val.field_2._9_4_ = local_23f;
  obj_value.val.field_2._13_2_ = local_23b;
  obj_value.val.field_2._M_local_buf[0xf] = local_239;
  obj_value.val._M_string_length = 0;
  local_248._0_1_ = 0;
  obj_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  obj_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  obj_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  obj_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  obj_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  obj_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"foo","");
  ::UniValue::UniValue<const_char_(&)[4],_char[4],_true>(&local_2d0,(char (*) [4])0xf98a78);
  key._M_string_length = in_stack_fffffffffffff7b0;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a8;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffff7b8;
  key.field_2._8_8_ = in_stack_fffffffffffff7c0;
  val_02._8_39_ = in_stack_fffffffffffff7d0;
  val_02._0_8_ = in_stack_fffffffffffff7c8;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = in_stack_fffffffffffff7f7;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = &in_stack_fffffffffffff7f8->first;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff800._0_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff800._8_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff810;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff818;
  ::UniValue::pushKV(&obj_value,key,val_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2d0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.val._M_dataplus._M_p != &local_2d0.val.field_2) {
    operator_delete(local_2d0.val._M_dataplus._M_p,local_2d0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"b","");
  local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
  ::UniValue::UniValue<bool,_bool,_true>(&local_348,(bool *)local_1e0);
  key_00._M_string_length = in_stack_fffffffffffff7b0;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a8;
  key_00.field_2._M_allocated_capacity = in_stack_fffffffffffff7b8;
  key_00.field_2._8_8_ = in_stack_fffffffffffff7c0;
  val_03._8_39_ = in_stack_fffffffffffff7d0;
  val_03._0_8_ = in_stack_fffffffffffff7c8;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = in_stack_fffffffffffff7f7;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = &in_stack_fffffffffffff7f8->first;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff800._0_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff800._8_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff810;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff818;
  ::UniValue::pushKV(&obj_value,key_00,val_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_348.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.val._M_dataplus._M_p != &local_348.val.field_2) {
    operator_delete(local_348.val._M_dataplus._M_p,local_348.val.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"n","");
  local_1e0._0_4_ = 1;
  ::UniValue::UniValue<int,_int,_true>(&local_3c0,(int *)local_1e0);
  key_01._M_string_length = in_stack_fffffffffffff7b0;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a8;
  key_01.field_2._M_allocated_capacity = in_stack_fffffffffffff7b8;
  key_01.field_2._8_8_ = in_stack_fffffffffffff7c0;
  val_04._8_39_ = in_stack_fffffffffffff7d0;
  val_04._0_8_ = in_stack_fffffffffffff7c8;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = in_stack_fffffffffffff7f7;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = &in_stack_fffffffffffff7f8->first;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff800._0_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff800._8_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff810;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff818;
  ::UniValue::pushKV(&obj_value,key_01,val_04);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.val._M_dataplus._M_p != &local_3c0.val.field_2) {
    operator_delete(local_3c0.val._M_dataplus._M_p,local_3c0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x239;
  file_04.m_begin = (iterator)&local_760;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_770,
             msg_04);
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3e0._0_8_ = &aStack_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"test","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[5],_UniValue_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [5])0x113a7cc,&obj_value);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_5a0,__l_03,(allocator_type *)&stack0xfffffffffffff7f8);
  HelpExampleCliNamed((string *)local_78,(string *)local_3e0,(RPCArgList *)&local_5a0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_78,
                     "> bitcoin-cli -named test name=\'{\"foo\":\"bar\",\"b\":false,\"n\":1}\'\n");
  local_580._M_dataplus._M_p._0_1_ = iVar3 == 0;
  local_580._M_string_length = 0;
  local_580.field_2._M_allocated_capacity = 0;
  local_5c0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5c0._8_8_ = "";
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_648._8_8_ = &local_5e0;
  local_678._0_8_ = "> bitcoin-cli -named test name=\'{\"foo\":\"bar\",\"b\":false,\"n\":1}\'\n";
  arr_value.val._M_dataplus._M_p = arr_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  arr_value._0_8_ = &PTR__lazy_ostream_013d7990;
  arr_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  arr_value.val.field_2._M_local_buf[0] = (char)&local_678;
  arr_value.val.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)&local_678 >> 8);
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_5e0._M_dataplus._M_p = (pointer)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_580,(lazy_ostream *)local_58,1,2,REQUIRE,0xeeed61,
             (size_t)local_5c0,0x239,local_658,
             "\"> bitcoin-cli -named test name=\'{\\\"foo\\\":\\\"bar\\\",\\\"b\\\":false,\\\"n\\\":1}\'\\n\""
             ,&arr_value);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_580.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_5a0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._0_8_ != &aStack_3d0) {
    operator_delete((void *)local_3e0._0_8_,(ulong)(aStack_3d0._M_allocated_capacity + 1));
  }
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x23a;
  file_05.m_begin = (iterator)&local_780;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_790,
             msg_05);
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3e0._0_8_ = &aStack_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"test","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[5],_UniValue_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [5])0x113a7cc,&obj_value);
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_5a0,__l_04,(allocator_type *)&stack0xfffffffffffff7f8);
  HelpExampleRpcNamed((string *)local_78,(string *)local_3e0,(RPCArgList *)&local_5a0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_78,
                     "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":{\"foo\":\"bar\",\"b\":false,\"n\":1}}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
                    );
  local_580._M_dataplus._M_p._0_1_ = iVar3 == 0;
  local_580._M_string_length = 0;
  local_580.field_2._M_allocated_capacity = 0;
  local_5c0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5c0._8_8_ = "";
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_648._8_8_ = &local_5e0;
  local_678._0_8_ =
       "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":{\"foo\":\"bar\",\"b\":false,\"n\":1}}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
  ;
  arr_value.val._M_dataplus._M_p = arr_value.val._M_dataplus._M_p & 0xffffffffffffff00;
  arr_value._0_8_ = &PTR__lazy_ostream_013d79d0;
  arr_value.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  arr_value.val.field_2._M_local_buf[0] = (char)&local_678;
  arr_value.val.field_2._M_allocated_capacity._1_7_ = (undefined7)((ulong)&local_678 >> 8);
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_5e0._M_dataplus._M_p = (pointer)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_580,(lazy_ostream *)local_58,1,2,REQUIRE,0xeeee1f,
             (size_t)local_5c0,0x23a,local_658,
             "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"name\\\":{\\\"foo\\\":\\\"bar\\\",\\\"b\\\":false,\\\"n\\\":1}}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
             ,&arr_value);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_580.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_5a0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._0_8_ != &aStack_3d0) {
    operator_delete((void *)local_3e0._0_8_,(ulong)(aStack_3d0._M_allocated_capacity + 1));
  }
  local_458 = local_448;
  local_450 = 0;
  arr_value.val._M_dataplus._M_p = (pointer)&arr_value.val.field_2;
  arr_value.typ = VARR;
  arr_value.val.field_2._M_local_buf[0] = '\0';
  arr_value.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_448._1_8_;
  arr_value.val.field_2._M_local_buf[8] = SUB81(local_448._1_8_,7);
  arr_value.val.field_2._9_4_ = local_43f;
  arr_value.val.field_2._13_2_ = local_43b;
  arr_value.val.field_2._M_local_buf[0xf] = local_439;
  arr_value.val._M_string_length = 0;
  local_448[0] = 0;
  arr_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arr_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arr_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arr_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  arr_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  arr_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::UniValue::UniValue<const_char_(&)[4],_char[4],_true>(&local_4b0,(char (*) [4])0xf98a78);
  val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b0;
  val._0_8_ = in_stack_fffffffffffff7a8;
  val.val._M_string_length = in_stack_fffffffffffff7b8;
  val.val.field_2._M_allocated_capacity = in_stack_fffffffffffff7c0;
  val.val.field_2._8_8_ = in_stack_fffffffffffff7c8;
  val._40_39_ = in_stack_fffffffffffff7d0;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish._7_1_ = in_stack_fffffffffffff7f7;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff7f8;
  ::UniValue::push_back(&arr_value,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0.val._M_dataplus._M_p != &local_4b0.val.field_2) {
    operator_delete(local_4b0.val._M_dataplus._M_p,local_4b0.val.field_2._M_allocated_capacity + 1);
  }
  local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
  ::UniValue::UniValue<bool,_bool,_true>(&local_508,(bool *)local_1e0);
  val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b0;
  val_00._0_8_ = in_stack_fffffffffffff7a8;
  val_00.val._M_string_length = in_stack_fffffffffffff7b8;
  val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffff7c0;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffff7c8;
  val_00._40_39_ = in_stack_fffffffffffff7d0;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff7f7;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff7f8;
  ::UniValue::push_back(&arr_value,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_508.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_508.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508.val._M_dataplus._M_p != &local_508.val.field_2) {
    operator_delete(local_508.val._M_dataplus._M_p,local_508.val.field_2._M_allocated_capacity + 1);
  }
  local_1e0._0_4_ = 1;
  ::UniValue::UniValue<int,_int,_true>(&local_560,(int *)local_1e0);
  val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b0;
  val_01._0_8_ = in_stack_fffffffffffff7a8;
  val_01.val._M_string_length = in_stack_fffffffffffff7b8;
  val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffff7c0;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffff7c8;
  val_01._40_39_ = in_stack_fffffffffffff7d0;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff7f7;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff7f8;
  ::UniValue::push_back(&arr_value,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_560.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_560.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.val._M_dataplus._M_p != &local_560.val.field_2) {
    operator_delete(local_560.val._M_dataplus._M_p,local_560.val.field_2._M_allocated_capacity + 1);
  }
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x241;
  file_06.m_begin = (iterator)&local_7a0;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_7b0,
             msg_06);
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013d3cb0;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"test","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[5],_UniValue_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [5])0x113a7cc,&arr_value);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)local_5c0,__l_05,(allocator_type *)&stack0xfffffffffffff7d8);
  HelpExampleCliNamed((string *)local_3e0,&local_580,(RPCArgList *)local_5c0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_3e0,"> bitcoin-cli -named test name=\'[\"bar\",false,1]\'\n");
  local_5a0._M_dataplus._M_p._0_1_ = iVar3 == 0;
  local_5a0._M_string_length = 0;
  local_5a0.field_2._M_allocated_capacity = 0;
  local_5e0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5e0._M_string_length = 0xeeaba1;
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_648._8_8_ = &local_678;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d7a10;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_678._0_8_ = (string *)local_3e0;
  local_48._8_8_ = (allocator_type *)&stack0xfffffffffffff7f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5a0,(lazy_ostream *)local_78,1,2,REQUIRE,0xeef009,
             (size_t)&local_5e0,0x241,local_658,
             "\"> bitcoin-cli -named test name=\'[\\\"bar\\\",false,1]\'\\n\"",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_5a0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._0_8_ != &aStack_3d0) {
    operator_delete((void *)local_3e0._0_8_,(ulong)(aStack_3d0._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)local_5c0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7b8 = "";
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x242;
  file_07.m_begin = (iterator)&local_7c0;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_7d0,
             msg_07);
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013d3cb0;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"test","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[5],_UniValue_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [5])0x113a7cc,&arr_value);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)local_5c0,__l_06,(allocator_type *)&stack0xfffffffffffff7d8);
  HelpExampleRpcNamed((string *)local_3e0,&local_580,(RPCArgList *)local_5c0);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_3e0,
                     "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":[\"bar\",false,1]}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
                    );
  local_5a0._M_dataplus._M_p._0_1_ = iVar3 == 0;
  local_5a0._M_string_length = 0;
  local_5a0.field_2._M_allocated_capacity = 0;
  local_5e0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_5e0._M_string_length = 0xeeaba1;
  local_658[8] = 0;
  local_658._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_648._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_648._8_8_ = &local_678;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d7a50;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_678._0_8_ = (string *)local_3e0;
  local_48._8_8_ = (allocator_type *)&stack0xfffffffffffff7f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5a0,(lazy_ostream *)local_78,1,2,REQUIRE,0xeef0a5,
             (size_t)&local_5e0,0x242,local_658,
             "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"name\\\":[\\\"bar\\\",false,1]}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
             ,local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_5a0.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._0_8_ != &aStack_3d0) {
    operator_delete((void *)local_3e0._0_8_,(ulong)(aStack_3d0._M_allocated_capacity + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)local_5c0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  file_08.m_end = (iterator)0x245;
  file_08.m_begin = (iterator)&local_7e0;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
             (size_t)&stack0xfffffffffffff810,msg_08);
  local_3e0._8_8_ = local_3e0._8_8_ & 0xffffffffffffff00;
  local_3e0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  aStack_3d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3d0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"foo","");
  local_659 = (ne_impl)0x1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [4])0x11651b2,(bool *)&local_659);
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff7f8,__l_07,(allocator_type *)&stack0xfffffffffffff7f7);
  HelpExampleCliNamed(&local_580,&local_5a0,(RPCArgList *)&stack0xfffffffffffff7f8);
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"foo","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_658,(char (*) [4])0x11651b2,(char (*) [5])0x11442fd);
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)local_658;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff7d8,__l_08,(allocator_type *)&stack0xfffffffffffff7d7);
  HelpExampleCliNamed((string *)local_5c0,&local_5e0,(RPCArgList *)&stack0xfffffffffffff7d8);
  if (local_580._M_string_length == local_5c0._8_8_) {
    if ((pointer)local_580._M_string_length == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar3 = bcmp(local_580._M_dataplus._M_p,(void *)local_5c0._0_8_,local_580._M_string_length);
      bVar8 = iVar3 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  local_678.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar8;
  local_678.m_message.px = (element_type *)0x0;
  local_678.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_680 = "";
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013d3d70;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_698 = (string *)local_5c0;
  local_690 = &local_580;
  aStack_68._8_8_ = &local_698;
  local_48._8_8_ = &local_690;
  boost::test_tools::tt_detail::report_assertion
            (&local_678,(lazy_ostream *)local_3e0,1,2,REQUIRE,0xeef26d,(size_t)&local_688,0x245,
             local_58,"HelpExampleCliNamed(\"foo\", {{\"arg\", \"true\"}})",local_78);
  boost::detail::shared_count::~shared_count(&local_678.m_message.pn);
  if ((pointer)local_5c0._0_8_ != (pointer)(local_5c0 + 0x10)) {
    operator_delete((void *)local_5c0._0_8_,(ulong)(local_5c0._16_8_ + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff7d8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_p != &local_620) {
    operator_delete(local_630._M_p,local_620._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._0_8_ != &local_648) {
    operator_delete((void *)local_658._0_8_,(ulong)(local_648._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff7f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  file_09.m_end = (iterator)0x248;
  file_09.m_begin = &stack0xfffffffffffff7c0;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
             (size_t)&stack0xfffffffffffff7b0,msg_09);
  local_3e0._8_8_ = local_3e0._8_8_ & 0xffffffffffffff00;
  local_3e0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  aStack_3d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_3d0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"foo","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1e0,(char (*) [4])0x11651b2,(bool *)&stack0xfffffffffffff7f7);
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)local_1e0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff7f8,__l_09,(allocator_type *)&stack0xfffffffffffff7d7);
  HelpExampleRpcNamed(&local_580,&local_5a0,(RPCArgList *)&stack0xfffffffffffff7f8);
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"foo","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_658,(char (*) [4])0x11651b2,(char (*) [5])0x11442fd);
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)local_658;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff7d8,__l_10,(allocator_type *)&stack0xfffffffffffff7af);
  HelpExampleRpcNamed((string *)local_5c0,&local_5e0,(RPCArgList *)&stack0xfffffffffffff7d8);
  boost::test_tools::tt_detail::ne_impl::operator()
            (&local_678,&local_659,&local_580,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0);
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_680 = "";
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d70;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013d3d70;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0;
  local_690 = &local_580;
  aStack_68._8_8_ = &local_698;
  local_48._8_8_ = &local_690;
  boost::test_tools::tt_detail::report_assertion
            (&local_678,(lazy_ostream *)local_3e0,1,3,REQUIRE,0xeef2c7,(size_t)&local_688,0x248,
             local_58,"HelpExampleRpcNamed(\"foo\", {{\"arg\", \"true\"}})",local_78);
  boost::detail::shared_count::~shared_count(&local_678.m_message.pn);
  if ((pointer)local_5c0._0_8_ != (pointer)(local_5c0 + 0x10)) {
    operator_delete((void *)local_5c0._0_8_,(ulong)(local_5c0._16_8_ + 1));
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff7d8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_p != &local_620) {
    operator_delete(local_630._M_p,local_620._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._0_8_ != &local_648) {
    operator_delete((void *)local_658._0_8_,(ulong)(local_648._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff7f8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != &local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&arr_value.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arr_value.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arr_value.val._M_dataplus._M_p != &arr_value.val.field_2) {
    operator_delete(arr_value.val._M_dataplus._M_p,
                    CONCAT71(arr_value.val.field_2._M_allocated_capacity._1_7_,
                             arr_value.val.field_2._M_local_buf[0]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&obj_value.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&obj_value.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_value.val._M_dataplus._M_p != &obj_value.val.field_2) {
    operator_delete(obj_value.val._M_dataplus._M_p,
                    CONCAT71(obj_value.val.field_2._M_allocated_capacity._1_7_,
                             obj_value.val.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector(&local_6b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(help_example)
{
    // test different argument types
    const RPCArgList& args = {{"foo", "bar"}, {"b", true}, {"n", 1}};
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", args), "> bitcoin-cli -named test foo=bar b=true n=1\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", args), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"foo\":\"bar\",\"b\":true,\"n\":1}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test shell escape
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b'ar"}}), "> bitcoin-cli -named test foo='b'''ar'\n");
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b\"ar"}}), "> bitcoin-cli -named test foo='b\"ar'\n");
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b ar"}}), "> bitcoin-cli -named test foo='b ar'\n");

    // test object params
    UniValue obj_value(UniValue::VOBJ);
    obj_value.pushKV("foo", "bar");
    obj_value.pushKV("b", false);
    obj_value.pushKV("n", 1);
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"name", obj_value}}), "> bitcoin-cli -named test name='{\"foo\":\"bar\",\"b\":false,\"n\":1}'\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", {{"name", obj_value}}), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":{\"foo\":\"bar\",\"b\":false,\"n\":1}}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test array params
    UniValue arr_value(UniValue::VARR);
    arr_value.push_back("bar");
    arr_value.push_back(false);
    arr_value.push_back(1);
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"name", arr_value}}), "> bitcoin-cli -named test name='[\"bar\",false,1]'\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", {{"name", arr_value}}), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":[\"bar\",false,1]}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test types don't matter for shell
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("foo", {{"arg", true}}), HelpExampleCliNamed("foo", {{"arg", "true"}}));

    // test types matter for Rpc
    BOOST_CHECK_NE(HelpExampleRpcNamed("foo", {{"arg", true}}), HelpExampleRpcNamed("foo", {{"arg", "true"}}));
}